

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.h
# Opt level: O0

object __thiscall
pybind11::eval<(pybind11::eval_mode)0>(pybind11 *this,str *expr,object *global,object *local)

{
  PyObject *pPVar1;
  undefined4 uVar2;
  bool bVar3;
  undefined8 uVar4;
  PyObject **ppPVar5;
  error_already_set *this_00;
  handle local_88;
  PyObject *local_80;
  PyObject *result;
  int start;
  str local_68 [4];
  string local_48 [8];
  string buffer;
  object *local_local;
  object *global_local;
  str *expr_local;
  
  bVar3 = handle::operator_cast_to_bool(&local->super_handle);
  if (!bVar3) {
    object::operator=(local,global);
  }
  str::operator_cast_to_string(local_68);
  std::operator+((char *)local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "# -*- coding: utf-8 -*-\n");
  std::__cxx11::string::~string((string *)local_68);
  result._0_4_ = 0x102;
  uVar4 = std::__cxx11::string::c_str();
  uVar2 = result._0_4_;
  ppPVar5 = handle::ptr(&global->super_handle);
  pPVar1 = *ppPVar5;
  ppPVar5 = handle::ptr(&local->super_handle);
  local_80 = (PyObject *)PyRun_StringFlags(uVar4,uVar2,pPVar1,*ppPVar5,0);
  if (local_80 == (PyObject *)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  handle::handle(&local_88,local_80);
  reinterpret_steal<pybind11::object>(this,local_88);
  std::__cxx11::string::~string(local_48);
  return (object)(handle)this;
}

Assistant:

object eval(str expr, object global = globals(), object local = object()) {
    if (!local)
        local = global;

    /* PyRun_String does not accept a PyObject / encoding specifier,
       this seems to be the only alternative */
    std::string buffer = "# -*- coding: utf-8 -*-\n" + (std::string) expr;

    int start;
    switch (mode) {
        case eval_expr:             start = Py_eval_input;   break;
        case eval_single_statement: start = Py_single_input; break;
        case eval_statements:       start = Py_file_input;   break;
        default: pybind11_fail("invalid evaluation mode");
    }

    PyObject *result = PyRun_String(buffer.c_str(), start, global.ptr(), local.ptr());
    if (!result)
        throw error_already_set();
    return reinterpret_steal<object>(result);
}